

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

float closest_point_ray_circle(vec3 ro,vec3 rd,vec3 cc,vec3 cn,float cr,float *s,vec3 *c1,vec3 *c2)

{
  vec3 *pvVar1;
  vec3 *pvVar2;
  _Bool _Var3;
  vec3 vVar4;
  vec3 vVar5;
  undefined8 local_248;
  float local_240;
  undefined8 local_228;
  float local_220;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_138;
  float local_130;
  int local_a8;
  float local_a4;
  int idx;
  float t;
  vec3 *c2_local;
  vec3 *c1_local;
  float *s_local;
  float local_80;
  float *local_78;
  vec3 cn_local;
  undefined1 local_58 [8];
  vec3 cc_local;
  vec3 rd_local;
  vec3 ro_local;
  
  local_80 = cn.z;
  s_local = cn._0_8_;
  cc_local.x = cc.z;
  register0x00001300 = cc._0_8_;
  register0x00001280 = rd._0_8_;
  _idx = c2;
  c2_local = c1;
  c1_local = (vec3 *)s;
  local_78 = s_local;
  cn_local.x = local_80;
  local_58 = (undefined1  [8])register0x00001300;
  _Var3 = ray_intersect_planes(ro,rd,(vec3 *)local_58,(vec3 *)&local_78,1,&local_a4,&local_a8);
  pvVar2 = c2_local;
  if (_Var3) {
    c1_local->x = local_a4;
    vVar5 = vec3_scale(rd,local_a4);
    vVar5 = vec3_add(ro,vVar5);
    pvVar1 = _idx;
    local_130 = vVar5.z;
    local_138 = vVar5._0_8_;
    pvVar2->z = local_130;
    pvVar2->x = (float)(undefined4)local_138;
    pvVar2->y = (float)local_138._4_4_;
    vVar4.z = cc_local.x;
    vVar4.x = (float)local_58._0_4_;
    vVar4.y = (float)local_58._4_4_;
    vVar5 = vec3_subtract(*c2_local,vVar4);
    vVar4 = vec3_set_length(vVar5,cr);
    vVar5.z = cc_local.x;
    vVar5.x = (float)local_58._0_4_;
    vVar5.y = (float)local_58._4_4_;
    vVar5 = vec3_add(vVar5,vVar4);
    local_1e0 = vVar5.z;
    local_1e8 = vVar5._0_8_;
    pvVar1->z = local_1e0;
    pvVar1->x = (float)(undefined4)local_1e8;
    pvVar1->y = (float)local_1e8._4_4_;
    ro_local.y = vec3_distance(*c2_local,*_idx);
  }
  else {
    c1_local->x = 3.4028235e+38;
    vVar5 = vec3_create(3.4028235e+38,3.4028235e+38,3.4028235e+38);
    pvVar1 = _idx;
    local_220 = vVar5.z;
    local_228 = vVar5._0_8_;
    pvVar2->z = local_220;
    pvVar2->x = (float)(undefined4)local_228;
    pvVar2->y = (float)local_228._4_4_;
    vVar5 = vec3_create(3.4028235e+38,3.4028235e+38,3.4028235e+38);
    local_248 = vVar5._0_8_;
    local_240 = vVar5.z;
    pvVar1->x = (float)(undefined4)local_248;
    pvVar1->y = (float)local_248._4_4_;
    pvVar1->z = local_240;
    ro_local.y = 3.4028235e+38;
  }
  return ro_local.y;
}

Assistant:

float closest_point_ray_circle(vec3 ro, vec3 rd, vec3 cc, vec3 cn, float cr, float *s, vec3 *c1, vec3 *c2) {
    float t;
    int idx;
    if (ray_intersect_planes(ro, rd, &cc, &cn, 1, &t, &idx)) {
        *s = t;
        *c1 = vec3_add(ro, vec3_scale(rd, t));    
        *c2 = vec3_add(cc, vec3_set_length(vec3_subtract(*c1, cc), cr));
        return vec3_distance(*c1, *c2);
    } else {
        // This is wrong, but probably doesn't matter...
        *s = FLT_MAX;
        *c1 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        *c2 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        return FLT_MAX;
    }
}